

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O2

void __thiscall
tyti::stl::
stl_parser_binary<double,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::stl_parser_binary(stl_parser_binary<double,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this)

{
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *this_00;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *this_01;
  actor<_f9bcd16b_> that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  ***local_108;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *****local_100;
  undefined1 local_f7 [3];
  undefined1 local_f4 [4];
  undefined1 local_f0 [4];
  undefined1 local_ec [4];
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ****local_e8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  that;
  undefined1 *local_d0;
  undefined1 *local_c8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_c0;
  undefined1 *local_b8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  *local_b0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_a8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_a0;
  undefined1 *local_98;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_90;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  **local_88;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ***local_80;
  undefined1 **local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  *local_50;
  undefined1 **local_48;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  **local_40;
  undefined1 **local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&that_1,"unnamed-grammar",(allocator<char> *)&local_108);
  this_00 = &this->start;
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = this_00;
  std::__cxx11::string::string
            ((string *)
             &(this->
              super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              ).name_,(string *)&that_1);
  std::__cxx11::string::~string((string *)&that_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&that_1,"unnamed-rule",(allocator<char> *)&local_108);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_00,(string *)&that_1);
  std::__cxx11::string::~string((string *)&that_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&that_1,"unnamed-rule",(allocator<char> *)&local_108);
  this_01 = &this->vector;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_01,(string *)&that_1);
  std::__cxx11::string::~string((string *)&that_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&that_1,"unnamed-rule",(allocator<char> *)&local_108);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->endSolid,(string *)&that_1);
  std::__cxx11::string::~string((string *)&that_1);
  local_108 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
               ***)&boost::spirit::little_bin_float;
  local_100 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *****)&boost::spirit::little_bin_float;
  that_1.proto_expr_.child0.proto_expr_.child1.proto_expr_.child2.proto_expr_ =
       (expr_type)&boost::spirit::little_bin_float;
  that_1.proto_expr_.child0.proto_expr_._0_8_ = (allocator<char> *)&local_108;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,tyti::stl::basic_vec3<double>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::little_bin_float>const&,boost::spirit::terminal<boost::spirit::tag::little_bin_float>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::little_bin_float>const&>,2l>>
            (this_01,&that_1);
  local_50 = &that;
  that.child0.args.super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_int>.
  super_store<0UL,_int>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_int>)(store<0UL,_int>)0x50;
  local_48 = &local_60;
  local_60 = &boost::spirit::byte_;
  local_58 = local_f7;
  local_40 = &local_50;
  that_2.child0.args.super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_int>.
  super_store<0UL,_int>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_int>)(store<0UL,_int>)0x3;
  that_1.proto_expr_.child0.proto_expr_.child1.proto_expr_.child2.proto_expr_.child0.proto_expr_.
  child0 = (expr_type)0x3;
  local_38 = &local_70;
  local_70 = &boost::spirit::little_dword;
  local_108 = &local_40;
  local_90 = &local_a0;
  local_98 = local_ec;
  local_b0 = &that_2;
  local_a8 = &local_c0;
  local_b8 = local_f0;
  local_88 = &local_b0;
  local_80 = &local_90;
  local_78 = &local_d0;
  local_d0 = &boost::spirit::little_word;
  local_c8 = local_f4;
  local_e8 = &local_80;
  local_100 = &local_e8;
  local_c0 = this_01;
  local_a0 = this_01;
  local_68 = (undefined1 *)&that_1;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_25fff550_>(this_00);
  return;
}

Assistant:

stl_parser_binary() : stl_parser_binary::base_type(start)
            {
                namespace spirit = boost::spirit;
                namespace qi = boost::spirit::qi;
                namespace ql = qi::labels;
                namespace ascii = boost::spirit::ascii;
                namespace px = boost::phoenix;

                vector %= spirit::little_bin_float >> spirit::little_bin_float >> spirit::little_bin_float;

                start =
                    qi::repeat(80)[spirit::byte_[px::at_c<0>(ql::_val) += ql::_1]]              //80x8-bit header
                    >> spirit::little_dword[px::reserve(px::at_c<1>(ql::_val), ql::_1),
                    px::reserve(px::at_c<2>(ql::_val), 3 * ql::_1),
                    px::reserve(px::at_c<3>(ql::_val), ql::_1)]    //# of triangles
                    >> *(vector[px::push_back(px::at_c<1>(ql::_val), ql::_1)]  //normal
                        >> spirit::repeat(3)[vector[px::push_back(px::at_c<2>(ql::_val), ql::_1)]] //vertices
                        >> spirit::little_word[px::push_back(px::at_c<3>(ql::_val), ql::_1)]  //attribute
                        )
                    //end
                    ;
            }